

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

json __thiscall
jsonnet::internal::(anonymous_namespace)::Interpreter::yamlTreeToJson_abi_cxx11_
          (Interpreter *this,Tree *tree)

{
  size_t id;
  json jVar1;
  ostringstream jsonStream;
  undefined1 local_1e8 [16];
  Tree *local_1d8;
  input_adapter local_1c8;
  _Any_data local_1b8;
  code *local_1a8;
  undefined8 uStack_1a0;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  if (tree->m_size == 0) {
    id = 0xffffffffffffffff;
  }
  else {
    id = c4::yml::Tree::root_id(tree);
  }
  local_1e8._8_8_ = 0;
  local_1e8._0_8_ = local_190;
  c4::yml::
  Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::emit_as((Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1e8,EMIT_JSON,tree,id,true);
  std::__cxx11::stringbuf::str();
  nlohmann::detail::input_adapter::
  input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
            (&local_1c8,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )local_1e8._0_8_,(char *)(local_1e8._0_8_ + local_1e8._8_8_));
  local_1a8 = (code *)0x0;
  uStack_1a0 = 0;
  local_1b8._M_unused._M_object = (void *)0x0;
  local_1b8._8_8_ = 0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::parse((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           *)this,&local_1c8,(parser_callback_t *)&local_1b8,true);
  if (local_1a8 != (code *)0x0) {
    (*local_1a8)(&local_1b8,&local_1b8,__destroy_functor);
  }
  if (local_1c8.ia.
      super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1c8.ia.
               super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8._0_8_ !=
      (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d8) {
    operator_delete((void *)local_1e8._0_8_,(ulong)((long)&local_1d8->m_buf + 1));
  }
  std::__cxx11::ostringstream::~ostringstream(local_190);
  jVar1 = (json)std::ios_base::~ios_base(local_120);
  return jVar1;
}

Assistant:

const json yamlTreeToJson(const ryml::Tree& tree) {
        std::ostringstream jsonStream;
        jsonStream << ryml::as_json(tree);
        return json::parse(jsonStream.str());
    }